

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  string *value;
  int i;
  int index;
  char *pcVar4;
  Message msg;
  AssertionResult local_68;
  AssertionResult gtest_ar;
  string expected;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar4 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  std::__cxx11::string::string((string *)&expected,pcVar4,(allocator *)&local_68);
  Message::Message(&msg);
  value = &this->substr_;
  if ((int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70) == 1) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar2->type_ == TVar1) {
      pcVar4 = strstr((pTVar2->message_)._M_dataplus._M_p,(value->_M_dataplus)._M_p);
      if (pcVar4 != (char *)0x0) {
        gtest_ar.success_ = true;
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        goto LAB_00109cc8;
      }
      local_68.success_ = false;
      local_68.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_68,(char (*) [11])0x129359);
      pAVar3 = AssertionResult::operator<<(pAVar3,&expected);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,value);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x129d27);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(&gtest_ar,pAVar3);
    }
    else {
      local_68.success_ = false;
      local_68.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_68,(char (*) [11])0x129359);
      pAVar3 = AssertionResult::operator<<(pAVar3,&expected);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x129a0a);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(&gtest_ar,pAVar3);
    }
  }
  else {
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"Expected: ");
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),(string *)&expected);
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"\n");
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"  Actual: ");
    std::ostream::operator<<
              ((void *)((long)msg.ss_.ptr_ + 0x10),
               (int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70));
    std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10)," failures");
    for (index = 0; index < (int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70);
        index = index + 1) {
      std::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),"\n");
      pTVar2 = TestPartResultArray::GetTestPartResult(this_00,index);
      testing::operator<<((ostream *)((long)msg.ss_.ptr_ + 0x10),pTVar2);
    }
    local_68.success_ = false;
    local_68.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<(&local_68,&msg);
    AssertionResult::AssertionResult(&gtest_ar,pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_68.message_);
LAB_00109cc8:
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&msg.ss_);
  std::__cxx11::string::~string((string *)&expected);
  if (gtest_ar.success_ == false) {
    Message::Message((Message *)&expected);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/chunmeng[P]cmake-project-base/build_O2/googletest-src/googletest/src/gtest.cc"
               ,0x2d7,pcVar4);
    AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&expected);
    AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expected);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)value);
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}